

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentmap.h
# Opt level: O2

void quicly_sentmap_commit(quicly_sentmap_t *map,uint16_t bytes_in_flight)

{
  byte *pbVar1;
  quicly_sent_t *pqVar2;
  
  pqVar2 = map->_pending_packet;
  if (pqVar2 != (quicly_sent_t *)0x0) {
    if (bytes_in_flight != 0) {
      pbVar1 = (byte *)((long)&pqVar2->data + 0x11);
      *pbVar1 = *pbVar1 | 1;
      (map->_pending_packet->data).packet.cc_bytes_in_flight = bytes_in_flight;
      map->bytes_in_flight = map->bytes_in_flight + (ulong)bytes_in_flight;
      pqVar2 = map->_pending_packet;
    }
    pbVar1 = (byte *)((long)&pqVar2->data + 0x11);
    *pbVar1 = *pbVar1 | 2;
    map->_pending_packet = (quicly_sent_t *)0x0;
    map->num_packets = map->num_packets + 1;
    return;
  }
  __assert_fail("quicly_sentmap_is_open(map)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/sentmap.h"
                ,0x10c,"void quicly_sentmap_commit(quicly_sentmap_t *, uint16_t)");
}

Assistant:

inline void quicly_sentmap_commit(quicly_sentmap_t *map, uint16_t bytes_in_flight)
{
    assert(quicly_sentmap_is_open(map));

    if (bytes_in_flight != 0) {
        map->_pending_packet->data.packet.ack_eliciting = 1;
        map->_pending_packet->data.packet.cc_bytes_in_flight = bytes_in_flight;
        map->bytes_in_flight += bytes_in_flight;
    }
    map->_pending_packet->data.packet.frames_in_flight = 1;
    map->_pending_packet = NULL;

    ++map->num_packets;
}